

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_object_type(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  char *name;
  wchar_t tval;
  object_kind *k;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getsym(p,"tval");
    wVar1 = tval_find_idx(name);
    if (wVar1 < L'\0') {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      *(wchar_t *)((long)pvVar2 + 0x24) = wVar1;
      *(object_base **)((long)pvVar2 + 0x10) = kb_info + *(int *)((long)pvVar2 + 0x24);
      *(int *)(*(long *)((long)pvVar2 + 0x10) + 0xac) =
           *(int *)(*(long *)((long)pvVar2 + 0x10) + 0xac) + 1;
      *(undefined4 *)((long)pvVar2 + 0x28) = *(undefined4 *)(*(long *)((long)pvVar2 + 0x10) + 0xac);
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_object_type(struct parser *p) {
	struct object_kind *k = parser_priv(p);
	int tval;

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	k->tval = tval;
	k->base = &kb_info[k->tval];
	k->base->num_svals++;
	k->sval = k->base->num_svals;
	return PARSE_ERROR_NONE;
}